

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::~Company(Company *this)

{
  Employee *this_00;
  Boss *this_01;
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(this->boss);
    if (iVar1 <= lVar2) break;
    this_00 = this->employees[lVar2];
    if (this_00 != (Employee *)0x0) {
      Person::~Person(&this_00->super_Person);
    }
    operator_delete(this_00,0xb8);
    lVar2 = lVar2 + 1;
  }
  this_01 = this->boss;
  if (this_01 != (Boss *)0x0) {
    Person::~Person((Person *)this_01);
  }
  operator_delete(this_01,0xc0);
  if (this->employees != (Employee **)0x0) {
    operator_delete__(this->employees);
    return;
  }
  return;
}

Assistant:

Company::~Company() {
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        delete employees[i];
    }
    delete boss;
    delete[] employees;
}